

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O2

void __thiscall
EqualEquation::genPattern
          (EqualEquation *this,vector<TokenPattern,_std::allocator<TokenPattern>_> *ops)

{
  TokenPattern *this_00;
  PatternExpression *pPVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  LowlevelError *this_01;
  TokenPattern *this_02;
  int iVar6;
  vector<long,_std::allocator<long>_> min;
  vector<long,_std::allocator<long>_> cur;
  vector<long,_std::allocator<long>_> max;
  vector<const_PatternValue_*,_std::allocator<const_PatternValue_*>_> semval;
  TokenPattern local_80;
  TokenPattern local_58;
  long lhsval;
  
  iVar3 = (*(((this->super_ValExpressEquation).lhs)->super_PatternExpression).
            _vptr_PatternExpression[10])();
  iVar4 = (*(((this->super_ValExpressEquation).lhs)->super_PatternExpression).
            _vptr_PatternExpression[0xb])();
  semval.super__Vector_base<const_PatternValue_*,_std::allocator<const_PatternValue_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  min.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  semval.super__Vector_base<const_PatternValue_*,_std::allocator<const_PatternValue_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  semval.super__Vector_base<const_PatternValue_*,_std::allocator<const_PatternValue_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  max.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  min.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  min.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  cur.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  max.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  max.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  cur.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  cur.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (*((this->super_ValExpressEquation).rhs)->_vptr_PatternExpression[4])();
  pPVar1 = (this->super_ValExpressEquation).rhs;
  (*pPVar1->_vptr_PatternExpression[5])(pPVar1,&min,&max);
  std::vector<long,_std::allocator<long>_>::operator=(&cur,&min);
  this_00 = &(this->super_ValExpressEquation).super_PatternEquation.resultpattern;
  iVar6 = 0;
  do {
    pPVar1 = (this->super_ValExpressEquation).rhs;
    local_80.pattern._0_4_ = 0;
    iVar5 = (*pPVar1->_vptr_PatternExpression[6])(pPVar1,&cur,&local_80);
    lhsval = CONCAT44(extraout_var_01,iVar5);
    if ((CONCAT44(extraout_var,iVar3) <= lhsval) && (lhsval <= CONCAT44(extraout_var_00,iVar4))) {
      if (iVar6 == 0) {
        buildPattern(&local_80,(this->super_ValExpressEquation).lhs,lhsval,&semval,&cur);
        TokenPattern::operator=(this_00,&local_80);
        this_02 = &local_80;
      }
      else {
        buildPattern(&local_58,(this->super_ValExpressEquation).lhs,lhsval,&semval,&cur);
        TokenPattern::doOr(&local_80,this_00,&local_58);
        TokenPattern::operator=(this_00,&local_80);
        TokenPattern::~TokenPattern(&local_80);
        this_02 = &local_58;
      }
      TokenPattern::~TokenPattern(this_02);
      iVar6 = iVar6 + 1;
    }
    bVar2 = advance_combo(&cur,&min,&max);
  } while (bVar2);
  if (iVar6 != 0) {
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&cur.super__Vector_base<long,_std::allocator<long>_>);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&max.super__Vector_base<long,_std::allocator<long>_>);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&min.super__Vector_base<long,_std::allocator<long>_>);
    std::_Vector_base<const_PatternValue_*,_std::allocator<const_PatternValue_*>_>::~_Vector_base
              (&semval.
                super__Vector_base<const_PatternValue_*,_std::allocator<const_PatternValue_*>_>);
    return;
  }
  this_01 = (LowlevelError *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string
            ((string *)&local_80,"Equal constraint is impossible to match",(allocator *)&local_58);
  LowlevelError::LowlevelError(this_01,(string *)&local_80);
  __cxa_throw(this_01,&SleighError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void EqualEquation::genPattern(const vector<TokenPattern> &ops) const

{
  intb lhsmin = lhs->minValue();
  intb lhsmax = lhs->maxValue();
  vector<const PatternValue *> semval;
  vector<intb> min;
  vector<intb> max;
  vector<intb> cur;
  int4 count=0;

  rhs->listValues(semval);
  rhs->getMinMax(min,max);
  cur = min;

  do {
    intb val = rhs->getSubValue(cur);
    if ((val>=lhsmin)&&(val<=lhsmax)) {
      if (count==0)
	resultpattern = buildPattern(lhs,val,semval,cur);
      else
	resultpattern = resultpattern.doOr(buildPattern(lhs,val,semval,cur));
      count += 1;
    }
  } while(advance_combo(cur,min,max));
  if (count == 0)
    throw SleighError("Equal constraint is impossible to match");
}